

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

void assign(gen_ctx_t gen_ctx)

{
  lr_gap_t *plVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  MIR_func_t func;
  bitmap_t bm;
  gen_ctx_t dst;
  VARR_reg_info_t *pVVar5;
  VARR_MIR_reg_t *pVVar6;
  VARR_allocno_info_t *pVVar7;
  VARR_bitmap_t *pVVar8;
  bitmap_t *ppVVar9;
  VARR_bitmap_t *pVVar10;
  VARR_live_range_t *pVVar11;
  live_range *plVar12;
  VARR_lr_gap_t *pVVar13;
  bitmap_t *ppVVar14;
  FILE *pFVar15;
  lr_gap_t *plVar16;
  byte bVar17;
  undefined1 auVar18 [16];
  undefined8 uVar19;
  undefined8 lr;
  MIR_type_t MVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  ulong *puVar24;
  gen_ctx_t pgVar25;
  char *pcVar26;
  gen_ctx_t gen_ctx_00;
  MIR_item_t_conflict pMVar27;
  live_range_t_conflict plVar28;
  MIR_item_t pMVar29;
  ra_ctx *prVar30;
  bitmap_t pVVar31;
  bitmap_el_t *pbVar32;
  size_t sVar33;
  MIR_module_t pMVar34;
  void *pvVar35;
  live_range *plVar36;
  MIR_item_t_conflict pMVar37;
  uint uVar38;
  uint uVar39;
  VARR_allocno_info_t *pVVar40;
  long lVar41;
  ulong uVar42;
  ulong uVar43;
  bool bVar44;
  char *pcVar45;
  bool bVar46;
  live_range *in_R8;
  size_t unaff_R12;
  lr_bb_t_conflict plVar47;
  MIR_reg_t reg;
  ulong uVar48;
  MIR_item_t lr_00;
  MIR_item_t_conflict pMVar49;
  ulong uVar50;
  MIR_item_t_conflict lr_01;
  ulong uVar51;
  lr_gap_t el;
  lr_gap_t el_00;
  lr_gap_t el_01;
  lr_gap_t el_02;
  ulong in_stack_fffffffffffffec8;
  MIR_reg_t local_124;
  uint local_e0;
  int local_dc;
  uint local_b8;
  undefined1 local_b4 [20];
  ra_ctx *local_a0;
  MIR_reg_t local_94;
  MIR_item_t_conflict local_90;
  ulong local_88;
  undefined1 local_80 [16];
  long local_70;
  live_range_t local_68;
  gen_ctx_t local_60;
  MIR_item_t_conflict local_58;
  live_range local_50;
  
  gen_ctx_00 = (gen_ctx_t)gen_ctx->ctx;
  uVar39 = gen_ctx->curr_cfg->max_var;
  pcVar45 = (char *)gen_ctx->curr_func_item->module;
  func = (gen_ctx->curr_func_item->u).func;
  local_60 = gen_ctx_00;
  puVar24 = (ulong *)_MIR_get_module_global_var_hard_regs
                               ((MIR_context_t)gen_ctx_00,(MIR_module_t_conflict)pcVar45);
  prVar30 = gen_ctx->ra_ctx;
  uVar2 = gen_ctx->optimize_level;
  bm = gen_ctx->temp_bitmap2;
  dst = (gen_ctx_t)prVar30->conflict_locs1;
  gen_ctx->func_stack_slots_num = 0;
  pVVar5 = gen_ctx->curr_cfg->reg_info;
  if (pVVar5 == (VARR_reg_info_t *)0x0) goto LAB_0016cc96;
  prVar30->curr_reg_infos = pVVar5->varr;
  pVVar6 = prVar30->reg_renumber;
  if ((pVVar6 == (VARR_MIR_reg_t *)0x0) || (pVVar6->varr == (MIR_reg_t *)0x0)) {
LAB_0016cc78:
    assign_cold_65();
  }
  else {
    pVVar40 = (VARR_allocno_info_t *)0x0;
    pVVar6->els_num = 0;
    do {
      pVVar6 = gen_ctx->ra_ctx->reg_renumber;
      pgVar25 = (gen_ctx_t)pVVar6->varr;
      if (pgVar25 == (gen_ctx_t)0x0) goto LAB_0016cbaa;
      sVar33 = pVVar6->els_num;
      uVar42 = sVar33 + 1;
      if (pVVar6->size < uVar42) {
        unaff_R12 = (uVar42 >> 1) + uVar42;
        pcVar45 = (char *)(unaff_R12 * 4);
        gen_ctx_00 = pgVar25;
        pgVar25 = (gen_ctx_t)realloc(pgVar25,(size_t)pcVar45);
        pVVar6->varr = (MIR_reg_t *)pgVar25;
        pVVar6->size = unaff_R12;
        sVar33 = pVVar6->els_num;
        uVar42 = sVar33 + 1;
      }
      uVar23 = (uint)unaff_R12;
      uVar38 = (int)pVVar40 + 1;
      pVVar40 = (VARR_allocno_info_t *)(ulong)uVar38;
      pVVar6->els_num = uVar42;
      *(undefined4 *)((long)pgVar25->call_used_hard_regs + sVar33 * 4 + -0x68) = 0xffffffff;
    } while (uVar38 <= uVar39);
    prVar30 = gen_ctx->ra_ctx;
    pVVar7 = prVar30->sorted_regs;
    if ((pVVar7 != (VARR_allocno_info_t *)0x0) && (pVVar7->varr != (allocno_info_t *)0x0)) {
      pVVar7->els_num = 0;
      local_b4._12_8_ = prVar30->curr_reg_infos;
      prVar30->start_mem_loc = 0x22;
      if (0x21 < uVar39) {
        uVar38 = 0x22;
        do {
          pVVar31 = gen_ctx->tied_regs;
          if (pVVar31 == (bitmap_t)0x0) goto LAB_0016cbc3;
          uVar42 = (ulong)uVar38;
          if (uVar42 < pVVar31->els_num << 6) {
            uVar48 = (ulong)((uint)(pVVar31->varr[uVar38 >> 6] >> (uVar42 & 0x3f)) & 1) << 0x20;
          }
          else {
            uVar48 = 0;
          }
          pVVar31 = gen_ctx->addr_regs;
          if (pVVar31 == (bitmap_t)0x0) goto LAB_0016cbc8;
          if ((uVar42 < pVVar31->els_num << 6) &&
             ((pVVar31->varr[uVar38 >> 6] >> (uVar42 & 0x3f) & 1) != 0)) {
            gen_ctx_00 = (gen_ctx_t)gen_ctx->ctx;
            MVar20 = MIR_reg_type((MIR_context_t)gen_ctx_00,uVar38 - 0x21,func);
            sVar33 = gen_ctx->func_stack_slots_num;
            unaff_R12 = 1;
            pcVar45 = (char *)0x0;
            do {
              uVar23 = 2;
              if ((int)pcVar45 == 0) {
                uVar23 = (uint)sVar33;
                pVVar40 = (VARR_allocno_info_t *)(ulong)(uVar23 + 0x22);
                bVar44 = uVar23 < 0xffffffde && MVar20 == MIR_T_LD;
                unaff_R12 = (size_t)(bVar44 + 1);
                uVar23 = (uint)((bVar44 & uVar23) == 0);
              }
              sVar33 = sVar33 + 1;
              pcVar45 = (char *)(ulong)uVar23;
            } while (uVar23 < (uint)unaff_R12);
            gen_ctx->func_stack_slots_num = sVar33;
            prVar30 = gen_ctx->ra_ctx;
            pVVar6 = prVar30->reg_renumber;
            if (((pVVar6 == (VARR_MIR_reg_t *)0x0) || (pVVar6->varr == (MIR_reg_t *)0x0)) ||
               (pVVar6->els_num <= uVar42)) goto LAB_0016cbd2;
            pVVar6->varr[uVar42] = (MIR_reg_t)pVVar40;
            prVar30->start_mem_loc = (MIR_reg_t)pVVar40 + (uint)unaff_R12;
            pgVar25 = (gen_ctx_t)gen_ctx->debug_file;
            if ((pgVar25 != (gen_ctx_t)0x0) && (1 < gen_ctx->debug_level)) {
              pcVar26 = MIR_reg_name(gen_ctx->ctx,uVar38 - 0x21,func);
              pcVar45 = " Assigning to addressable %s:reg=%3u (freq %-3ld) -- %lu\n";
              in_R8 = (live_range *)gen_ctx->ra_ctx->curr_reg_infos[uVar42].freq;
              fprintf((FILE *)pgVar25," Assigning to addressable %s:reg=%3u (freq %-3ld) -- %lu\n",
                      pcVar26,uVar42,in_R8,(ulong)pVVar40 & 0xffffffff);
              gen_ctx_00 = pgVar25;
            }
          }
          else {
            pVVar40 = gen_ctx->ra_ctx->sorted_regs;
            pgVar25 = (gen_ctx_t)pVVar40->varr;
            if (pgVar25 == (gen_ctx_t)0x0) goto LAB_0016cbd7;
            sVar33 = pVVar40->els_num;
            uVar50 = sVar33 + 1;
            if (pVVar40->size < uVar50) {
              sVar33 = (uVar50 >> 1) + uVar50;
              gen_ctx_00 = pgVar25;
              pgVar25 = (gen_ctx_t)realloc(pgVar25,sVar33 * 0x10);
              pVVar40->varr = (allocno_info_t *)pgVar25;
              pVVar40->size = sVar33;
              sVar33 = pVVar40->els_num;
              uVar50 = sVar33 + 1;
            }
            pVVar40->els_num = uVar50;
            pgVar25->call_used_hard_regs[sVar33 * 2 + -0xd] = (bitmap_t)(uVar48 | uVar42);
            pgVar25->call_used_hard_regs[sVar33 * 2 + -0xc] = (bitmap_t)local_b4._12_8_;
            pVVar11 = gen_ctx->lr_ctx->var_live_ranges;
            if (((pVVar11 == (VARR_live_range_t *)0x0) ||
                (pVVar11->varr == (live_range_t_conflict *)0x0)) || (pVVar11->els_num <= uVar42))
            goto LAB_0016cba5;
            sVar33 = 0;
            for (plVar28 = pVVar11->varr[uVar42]; plVar28 != (live_range_t_conflict)0x0;
                plVar28 = plVar28->next) {
              sVar33 = sVar33 + (long)((plVar28->finish - plVar28->start) + 1);
            }
            gen_ctx->ra_ctx->curr_reg_infos[uVar42].live_length = sVar33;
            pcVar45 = (char *)local_b4._12_8_;
          }
          uVar23 = (uint)unaff_R12;
          uVar38 = uVar38 + 1;
        } while (uVar38 <= uVar39);
      }
      local_b4._0_4_ = uVar23;
      if (-1 < gen_ctx->lr_ctx->curr_point) {
        uVar42 = 0;
        do {
          prVar30 = gen_ctx->ra_ctx;
          pVVar8 = prVar30->used_locs;
          if (pVVar8 == (VARR_bitmap_t *)0x0) goto LAB_0016cbf0;
          uVar48 = pVVar8->els_num;
          pcVar45 = (char *)(long)(int)uVar48;
          if ((long)pcVar45 <= (long)uVar42) break;
          ppVVar9 = pVVar8->varr;
          bVar44 = ppVVar9 != (bitmap_t *)0x0;
          pcVar45 = (char *)CONCAT71((int7)(int3)(uVar48 >> 8),bVar44);
          if (puVar24 == (ulong *)0x0) {
            if (uVar48 <= uVar42 || !bVar44) goto LAB_0016cc40;
            pVVar31 = ppVVar9[uVar42];
            if ((pVVar31 == (bitmap_t)0x0) || (pVVar31->varr == (bitmap_el_t *)0x0))
            goto LAB_0016cbff;
            pVVar31->els_num = 0;
            if (1 < uVar2) {
              pVVar8 = prVar30->busy_used_locs;
              if (((pVVar8 != (VARR_bitmap_t *)0x0) && (pVVar8->varr != (bitmap_t *)0x0)) &&
                 (uVar42 < pVVar8->els_num)) {
                pVVar31 = pVVar8->varr[uVar42];
                if ((pVVar31 != (bitmap_t)0x0) && (pVVar31->varr != (bitmap_el_t *)0x0)) {
                  pVVar31->els_num = 0;
                  goto LAB_0016b660;
                }
                goto LAB_0016cc3b;
              }
              goto LAB_0016cc1d;
            }
          }
          else {
            if (uVar48 <= uVar42 || !bVar44) goto LAB_0016cc18;
            pVVar31 = ppVVar9[uVar42];
            if (pVVar31 == (bitmap_t)0x0) goto LAB_0016cc13;
            uVar48 = pVVar31->els_num;
            uVar50 = *puVar24;
            if (uVar50 <= uVar48) {
              gen_ctx_00 = (gen_ctx_t)pVVar31->varr;
              if (gen_ctx_00 != (gen_ctx_t)0x0) {
                pVVar31->els_num = uVar50;
                goto LAB_0016b56a;
              }
              assign_cold_7();
LAB_0016cc6e:
              assign_cold_10();
LAB_0016cc73:
              assign_cold_38();
              goto LAB_0016cc78;
            }
            lVar41 = (uVar50 & 0x3ffffffffffffff) - uVar48;
            if ((uVar50 & 0x3ffffffffffffff) < uVar48 || lVar41 == 0) {
              gen_ctx_00 = (gen_ctx_t)pVVar31->varr;
            }
            else {
              gen_ctx_00 = (gen_ctx_t)pVVar31->varr;
              do {
                if (gen_ctx_00 == (gen_ctx_t)0x0) goto LAB_0016cb96;
                sVar33 = pVVar31->els_num;
                uVar48 = sVar33 + 1;
                if (pVVar31->size < uVar48) {
                  sVar33 = (uVar48 >> 1) + uVar48;
                  gen_ctx_00 = (gen_ctx_t)realloc(gen_ctx_00,sVar33 * 8);
                  pVVar31->varr = (bitmap_el_t *)gen_ctx_00;
                  pVVar31->size = sVar33;
                  sVar33 = pVVar31->els_num;
                  uVar48 = sVar33 + 1;
                }
                lVar41 = lVar41 + -1;
                pVVar31->els_num = uVar48;
                gen_ctx_00->call_used_hard_regs[sVar33 - 0xd] = (bitmap_t)0x0;
              } while (lVar41 != 0);
            }
LAB_0016b56a:
            pcVar45 = (char *)puVar24[2];
            memcpy(gen_ctx_00,pcVar45,uVar50 << 3);
            if (1 < uVar2) {
              pVVar8 = gen_ctx->ra_ctx->busy_used_locs;
              if (((pVVar8 != (VARR_bitmap_t *)0x0) && (pVVar8->varr != (bitmap_t *)0x0)) &&
                 (uVar42 < pVVar8->els_num)) {
                pVVar31 = pVVar8->varr[uVar42];
                if (pVVar31 == (bitmap_t)0x0) goto LAB_0016cc6e;
                uVar48 = pVVar31->els_num;
                uVar50 = *puVar24;
                if (uVar48 < uVar50) {
                  lVar41 = (uVar50 & 0x3ffffffffffffff) - uVar48;
                  if ((uVar50 & 0x3ffffffffffffff) < uVar48 || lVar41 == 0) {
                    gen_ctx_00 = (gen_ctx_t)pVVar31->varr;
                  }
                  else {
                    gen_ctx_00 = (gen_ctx_t)pVVar31->varr;
                    do {
                      if (gen_ctx_00 == (gen_ctx_t)0x0) goto LAB_0016cbb9;
                      sVar33 = pVVar31->els_num;
                      uVar48 = sVar33 + 1;
                      if (pVVar31->size < uVar48) {
                        sVar33 = (uVar48 >> 1) + uVar48;
                        gen_ctx_00 = (gen_ctx_t)realloc(gen_ctx_00,sVar33 * 8);
                        pVVar31->varr = (bitmap_el_t *)gen_ctx_00;
                        pVVar31->size = sVar33;
                        sVar33 = pVVar31->els_num;
                        uVar48 = sVar33 + 1;
                      }
                      lVar41 = lVar41 + -1;
                      pVVar31->els_num = uVar48;
                      gen_ctx_00->call_used_hard_regs[sVar33 - 0xd] = (bitmap_t)0x0;
                    } while (lVar41 != 0);
                  }
                }
                else {
                  gen_ctx_00 = (gen_ctx_t)pVVar31->varr;
                  if (gen_ctx_00 == (gen_ctx_t)0x0) goto LAB_0016cc87;
                  pVVar31->els_num = uVar50;
                }
                pcVar45 = (char *)puVar24[2];
                memcpy(gen_ctx_00,pcVar45,uVar50 << 3);
                goto LAB_0016b660;
              }
              goto LAB_0016cbf5;
            }
          }
LAB_0016b660:
          bVar44 = (long)uVar42 < (long)gen_ctx->lr_ctx->curr_point;
          uVar42 = uVar42 + 1;
        } while (bVar44);
      }
LAB_0016b8d7:
      prVar30 = gen_ctx->ra_ctx;
      if (prVar30->used_locs != (VARR_bitmap_t *)0x0) {
        if (gen_ctx->lr_ctx->curr_point < (int)prVar30->used_locs->els_num) {
          pVVar40 = prVar30->sorted_regs;
          if (pVVar40 == (VARR_allocno_info_t *)0x0) goto LAB_0016cc9b;
          local_b4._4_8_ = pVVar40->els_num;
          gen_ctx_00 = (gen_ctx_t)pVVar40->varr;
          pcVar45 = (char *)(long)(int)local_b4._4_8_;
          qsort(gen_ctx_00,(size_t)pcVar45,0x10,allocno_info_compare_func);
          pVVar8 = gen_ctx->ra_ctx->used_locs;
          if (pVVar8 == (VARR_bitmap_t *)0x0) goto LAB_0016cca0;
          pVVar10 = gen_ctx->ra_ctx->busy_used_locs;
          if (pVVar10 == (VARR_bitmap_t *)0x0) goto LAB_0016cca5;
          ppVVar9 = pVVar8->varr;
          local_b4._12_8_ = pVVar10->varr;
          pMVar27 = (MIR_item_t_conflict)0x0;
          goto LAB_0016b967;
        }
        pMVar27 = (MIR_item_t_conflict)malloc(0x18);
        gen_ctx_00 = (gen_ctx_t)0x8;
        pMVar27->data = (void *)0x0;
        pMVar27->module = (MIR_module_t)0x1;
        pgVar25 = (gen_ctx_t)malloc(8);
        (pMVar27->item_link).prev = (MIR_item_t)pgVar25;
        if (puVar24 != (ulong *)0x0) {
          uVar42 = *puVar24;
          if (uVar42 == 0) {
            if (pgVar25 == (gen_ctx_t)0x0) goto LAB_0016cc04;
            pMVar27->data = (void *)0x0;
          }
          else {
            uVar48 = uVar42 & 0x3ffffffffffffff;
            if (uVar48 != 0) {
LAB_0016b6ce:
              if (pgVar25 != (gen_ctx_t)0x0) goto code_r0x0016b6d7;
              assign_cold_19();
LAB_0016cb7d:
              assign_cold_45();
              goto LAB_0016cb82;
            }
          }
LAB_0016b733:
          pcVar45 = (char *)puVar24[2];
          memcpy(pgVar25,pcVar45,uVar42 << 3);
          prVar30 = gen_ctx->ra_ctx;
          gen_ctx_00 = pgVar25;
        }
        pVVar8 = prVar30->used_locs;
        pgVar25 = (gen_ctx_t)pVVar8->varr;
        if (pgVar25 == (gen_ctx_t)0x0) goto LAB_0016cbb4;
        sVar33 = pVVar8->els_num;
        uVar42 = sVar33 + 1;
        if (pVVar8->size < uVar42) {
          sVar33 = (uVar42 >> 1) + uVar42;
          pcVar45 = (char *)(sVar33 * 8);
          gen_ctx_00 = pgVar25;
          pgVar25 = (gen_ctx_t)realloc(pgVar25,(size_t)pcVar45);
          pVVar8->varr = (bitmap_t *)pgVar25;
          pVVar8->size = sVar33;
          sVar33 = pVVar8->els_num;
          uVar42 = sVar33 + 1;
        }
        pVVar8->els_num = uVar42;
        pgVar25->call_used_hard_regs[sVar33 - 0xd] = (bitmap_t)pMVar27;
        if (1 < uVar2) {
          pMVar27 = (MIR_item_t_conflict)malloc(0x18);
          gen_ctx_00 = (gen_ctx_t)0x8;
          pMVar27->data = (void *)0x0;
          pMVar27->module = (MIR_module_t)0x1;
          pgVar25 = (gen_ctx_t)malloc(8);
          (pMVar27->item_link).prev = (MIR_item_t)pgVar25;
          if (puVar24 != (ulong *)0x0) {
            uVar42 = *puVar24;
            if (uVar42 == 0) {
              if (pgVar25 == (gen_ctx_t)0x0) goto LAB_0016cc45;
              pMVar27->data = (void *)0x0;
            }
            else {
              for (uVar48 = uVar42 & 0x3ffffffffffffff; uVar48 != 0; uVar48 = uVar48 - 1) {
                if (pgVar25 == (gen_ctx_t)0x0) goto LAB_0016cb82;
                pvVar35 = pMVar27->data;
                pMVar34 = (MIR_module_t)((long)pvVar35 + 1);
                if (pMVar27->module < pMVar34) {
                  pMVar34 = (MIR_module_t)((long)&pMVar34->data + ((ulong)pMVar34 >> 1));
                  pgVar25 = (gen_ctx_t)realloc(pgVar25,(long)pMVar34 * 8);
                  (pMVar27->item_link).prev = (MIR_item_t)pgVar25;
                  pMVar27->module = pMVar34;
                  pvVar35 = pMVar27->data;
                  pMVar34 = (MIR_module_t)((long)pvVar35 + 1);
                }
                pMVar27->data = pMVar34;
                pgVar25->call_used_hard_regs[(long)pvVar35 + -0xd] = (bitmap_t)0x0;
              }
            }
            pcVar45 = (char *)puVar24[2];
            memcpy(pgVar25,pcVar45,uVar42 << 3);
            gen_ctx_00 = pgVar25;
          }
          pVVar8 = gen_ctx->ra_ctx->busy_used_locs;
          pgVar25 = (gen_ctx_t)pVVar8->varr;
          if (pgVar25 == (gen_ctx_t)0x0) goto LAB_0016cbcd;
          sVar33 = pVVar8->els_num;
          uVar42 = sVar33 + 1;
          if (pVVar8->size < uVar42) {
            sVar33 = (uVar42 >> 1) + uVar42;
            pcVar45 = (char *)(sVar33 * 8);
            gen_ctx_00 = pgVar25;
            pgVar25 = (gen_ctx_t)realloc(pgVar25,(size_t)pcVar45);
            pVVar8->varr = (bitmap_t *)pgVar25;
            pVVar8->size = sVar33;
            sVar33 = pVVar8->els_num;
            uVar42 = sVar33 + 1;
          }
          pVVar8->els_num = uVar42;
          pgVar25->call_used_hard_regs[sVar33 - 0xd] = (bitmap_t)pMVar27;
        }
        goto LAB_0016b8d7;
      }
      goto LAB_0016cbaf;
    }
  }
  assign_cold_63();
  goto LAB_0016cc82;
code_r0x0016b6d7:
  pvVar35 = pMVar27->data;
  pMVar34 = (MIR_module_t)((long)pvVar35 + 1);
  if (pMVar27->module < pMVar34) {
    pMVar34 = (MIR_module_t)((long)&pMVar34->data + ((ulong)pMVar34 >> 1));
    pgVar25 = (gen_ctx_t)realloc(pgVar25,(long)pMVar34 * 8);
    (pMVar27->item_link).prev = (MIR_item_t)pgVar25;
    pMVar27->module = pMVar34;
    pvVar35 = pMVar27->data;
    pMVar34 = (MIR_module_t)((long)pvVar35 + 1);
  }
  uVar48 = uVar48 - 1;
  pMVar27->data = pMVar34;
  pgVar25->call_used_hard_regs[(long)pvVar35 + -0xd] = (bitmap_t)0x0;
  if (uVar48 == 0) goto LAB_0016b733;
  goto LAB_0016b6ce;
LAB_0016cb54:
  assign_cold_41();
LAB_0016cb59:
  __assert_fail("lr->lr_bb != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x1c49,"void insert_lr_gap(gen_ctx_t, int, MIR_type_t, MIR_reg_t, live_range_t)");
LAB_0016cb82:
  assign_cold_21();
LAB_0016cb87:
  assign_cold_58();
LAB_0016cb8c:
  assign_cold_56();
LAB_0016cb91:
  assign_cold_55();
LAB_0016cb96:
  assign_cold_12();
LAB_0016cb9b:
  assign_cold_49();
LAB_0016cba0:
  assign_cold_43();
LAB_0016cba5:
  assign_cold_2();
LAB_0016cbaa:
  assign_cold_64();
LAB_0016cbaf:
  assign_cold_62();
LAB_0016cbb4:
  assign_cold_24();
LAB_0016cbb9:
  assign_cold_9();
LAB_0016cbbe:
  assign_cold_54();
LAB_0016cbc3:
  assign_cold_5();
LAB_0016cbc8:
  assign_cold_4();
LAB_0016cbcd:
  assign_cold_23();
LAB_0016cbd2:
  assign_cold_1();
LAB_0016cbd7:
  assign_cold_3();
LAB_0016cbdc:
  assign_cold_34();
LAB_0016cbe1:
  assign_cold_28();
LAB_0016cbe6:
  assign_cold_53();
LAB_0016cbeb:
  assign_cold_29();
LAB_0016cbf0:
  assign_cold_18();
LAB_0016cbf5:
  assign_cold_11();
LAB_0016cbfa:
  assign_cold_35();
LAB_0016cbff:
  assign_cold_17();
LAB_0016cc04:
  assign_cold_20();
LAB_0016cc09:
  assign_cold_47();
LAB_0016cc0e:
  assign_cold_48();
LAB_0016cc13:
  assign_cold_13();
LAB_0016cc18:
  assign_cold_6();
LAB_0016cc1d:
  assign_cold_16();
LAB_0016cc22:
  assign_cold_32();
LAB_0016cc27:
  assign_cold_37();
LAB_0016cc2c:
  assign_cold_50();
LAB_0016cc31:
  assign_cold_51();
LAB_0016cc36:
  assign_cold_52();
LAB_0016cc3b:
  assign_cold_15();
LAB_0016cc40:
  assign_cold_14();
LAB_0016cc45:
  assign_cold_22();
LAB_0016cc4a:
  __assert_fail("hard_reg >= 0 && hard_reg <= ST1_HARD_REG && target_locs_num (hard_reg, type) == 1"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x1dac,"void assign(gen_ctx_t)");
  while( true ) {
    plVar28 = pVVar11->varr[(long)pMVar27];
    pMVar49 = (MIR_item_t_conflict)((long)&pMVar27->data + 1);
    if (plVar28 != (live_range_t_conflict)0x0) {
      uVar42 = 1L << ((ulong)pMVar27 & 0x3f);
      do {
        if (plVar28->start <= plVar28->finish) {
          lVar41 = (long)plVar28->start + -1;
          do {
            pgVar25 = (gen_ctx_t)ppVVar9[lVar41 + 1];
            pcVar45 = (char *)pMVar49;
            gen_ctx_00 = pgVar25;
            bitmap_expand((bitmap_t)pgVar25,(size_t)pMVar49);
            if (pgVar25 == (gen_ctx_t)0x0) goto LAB_0016cb02;
            pMVar27 = ((DLIST_MIR_item_t *)&pgVar25->curr_func_item)->head;
            pMVar27->data = (void *)((ulong)pMVar27->data | uVar42);
            if (1 < uVar2) {
              pgVar25 = (gen_ctx_t)((MIR_module_t *)(local_b4._12_8_ + 8))[lVar41];
              pcVar45 = (char *)pMVar49;
              gen_ctx_00 = pgVar25;
              bitmap_expand((bitmap_t)pgVar25,(size_t)pMVar49);
              if (pgVar25 == (gen_ctx_t)0x0) goto LAB_0016cb07;
              pMVar27 = ((DLIST_MIR_item_t *)&pgVar25->curr_func_item)->head;
              pMVar27->data = (void *)((ulong)pMVar27->data | uVar42);
            }
            lVar41 = lVar41 + 1;
          } while (lVar41 < plVar28->finish);
        }
        plVar28 = plVar28->next;
      } while (plVar28 != (live_range_t)0x0);
    }
    pMVar27 = pMVar49;
    if (pMVar49 == (MIR_item_t_conflict)0x22) break;
LAB_0016b967:
    pVVar11 = gen_ctx->lr_ctx->var_live_ranges;
    if (((pVVar11 == (VARR_live_range_t *)0x0) || (pVVar11->varr == (live_range_t_conflict *)0x0))
       || ((MIR_item_t_conflict)pVVar11->els_num <= pMVar27)) goto LAB_0016cb87;
  }
  pVVar31 = gen_ctx->func_used_hard_regs;
  if ((pVVar31 != (bitmap_t)0x0) && (pVVar31->varr != (bitmap_el_t *)0x0)) {
    pVVar31->els_num = 0;
    if (1 < uVar2) {
      HTAB_lr_gap_t_clear(gen_ctx->ra_ctx->lr_gap_tab);
    }
    if (0 < (int)local_b4._4_4_) {
      uVar42 = 0;
      local_b4._4_8_ = ZEXT48(local_b4._4_4_ & 0x7fffffff);
      do {
        pVVar40 = gen_ctx->ra_ctx->sorted_regs;
        if (((pVVar40 == (VARR_allocno_info_t *)0x0) || (pVVar40->varr == (allocno_info_t *)0x0)) ||
           (pVVar40->els_num <= uVar42)) goto LAB_0016cb8c;
        pVVar6 = gen_ctx->ra_ctx->reg_renumber;
        if ((pVVar6 == (VARR_MIR_reg_t *)0x0) || (pVVar6->varr == (MIR_reg_t *)0x0))
        goto LAB_0016cb91;
        plVar12 = *(live_range **)(pVVar40->varr + uVar42);
        uVar48 = (ulong)plVar12 & 0xffffffff;
        if (pVVar6->els_num <= uVar48) goto LAB_0016cb91;
        local_88 = uVar42;
        if (pVVar6->varr[uVar48] == 0xffffffff) {
          gen_ctx_00 = (gen_ctx_t)gen_ctx->ctx;
          iVar3 = (int)plVar12;
          reg = iVar3 - 0x21;
          MVar20 = MIR_reg_type((MIR_context_t)gen_ctx_00,reg,func);
          pgVar25 = local_60;
          pVVar40 = gen_ctx->ra_ctx->sorted_regs;
          if (((pVVar40 == (VARR_allocno_info_t *)0x0) || (pVVar40->varr == (allocno_info_t *)0x0))
             || (pVVar40->els_num <= local_88)) goto LAB_0016cbbe;
          if (pVVar40->varr[uVar42].tied_reg_p == 0) {
            pVVar11 = gen_ctx->lr_ctx->var_live_ranges;
            if (((pVVar11 == (VARR_live_range_t *)0x0) ||
                (pVVar11->varr == (live_range_t_conflict *)0x0)) || (pVVar11->els_num <= uVar48))
            goto LAB_0016cbe6;
            pMVar27 = (MIR_item_t_conflict)pVVar11->varr[uVar48];
            if (pMVar27 != (MIR_item_t_conflict)0x0) {
              if ((dst == (gen_ctx_t)0x0) || (dst->curr_func_item == (MIR_item_t)0x0))
              goto LAB_0016cc36;
              dst->ctx = (MIR_context_t)0x0;
              local_90 = pMVar27;
              do {
                if (*(int *)&pMVar27->module <= *(int *)((long)&pMVar27->module + 4)) {
                  lVar41 = (long)*(int *)&pMVar27->module + -1;
                  do {
                    gen_ctx_00 = dst;
                    bitmap_ior((bitmap_t)dst,(bitmap_t)dst,ppVVar9[lVar41 + 1]);
                    lVar41 = lVar41 + 1;
                  } while (lVar41 < *(int *)((long)&pMVar27->module + 4));
                }
                pMVar27 = (pMVar27->item_link).next;
              } while (pMVar27 != (MIR_item_t)0x0);
              prVar30 = gen_ctx->ra_ctx;
              pVVar13 = prVar30->spill_gaps;
              if ((pVVar13 == (VARR_lr_gap_t *)0x0) || (pVVar13->varr == (lr_gap_t *)0x0))
              goto LAB_0016cc31;
              pVVar13->els_num = 0;
              local_124 = 0xffffffff;
              plVar36 = (live_range *)0x0;
              pcVar45 = (char *)0x0;
              bVar44 = MVar20 == MIR_T_P || MVar20 < MIR_T_F;
              do {
                if (plVar36 < (live_range *)((long)dst->ctx << 6)) {
                  if (MVar20 != MIR_T_LD) {
                    gen_ctx_00 = (gen_ctx_t)dst->curr_func_item;
                    in_R8 = (live_range *)(1L << ((ulong)plVar36 & 0x3f) & (ulong)gen_ctx_00->ctx);
                    if (in_R8 == (live_range *)0x0) goto LAB_0016bc93;
                  }
                }
                else if (MVar20 != MIR_T_LD) {
LAB_0016bc93:
                  bVar46 = plVar36 < (live_range *)0x10 != bVar44;
                  gen_ctx_00 = (gen_ctx_t)CONCAT71((int7)((ulong)gen_ctx_00 >> 8),bVar46);
                  if (!bVar46) {
                    uVar39 = (uint)plVar36;
                    gen_ctx_00 = (gen_ctx_t)(ulong)(uVar39 & 0x3e);
                    if ((0x20 < (uVar39 & 0x3e)) ||
                       (in_R8 = (live_range *)&DAT_101000410,
                       (0x101000410U >> (long)gen_ctx_00 & 1) == 0)) {
                      if (local_124 == 0xffffffff) {
                        gen_ctx_00 = (gen_ctx_t)gen_ctx->call_used_hard_regs[0x12];
                        if (gen_ctx_00 == (gen_ctx_t)0x0) goto LAB_0016cc91;
                        in_R8 = (live_range *)((long)gen_ctx_00->ctx << 6);
LAB_0016bd19:
                        local_124 = uVar39;
                        if (plVar36 < in_R8) {
                          pcVar45 = (char *)(ulong)(~(uint)((ulong)gen_ctx_00->curr_func_item->data
                                                           >> ((ulong)plVar36 & 0x3f)) & 1);
                        }
                        else {
                          pcVar45 = &DAT_00000001;
                        }
                      }
                      else if ((int)pcVar45 == 0) {
                        pcVar45 = (char *)0x0;
                      }
                      else {
                        gen_ctx_00 = (gen_ctx_t)gen_ctx->call_used_hard_regs[0x12];
                        if (gen_ctx_00 == (gen_ctx_t)0x0) goto LAB_0016cc8c;
                        pcVar45 = &DAT_00000001;
                        in_R8 = (live_range *)((long)gen_ctx_00->ctx << 6);
                        if ((plVar36 < in_R8) &&
                           (((ulong)gen_ctx_00->curr_func_item->data >> ((ulong)plVar36 & 0x3f) & 1)
                            != 0)) goto LAB_0016bd19;
                      }
                    }
                  }
                }
                plVar36 = (live_range *)((long)&plVar36->lr_bb + 1);
              } while (plVar36 != (live_range *)0x22);
              local_94 = reg;
              if (local_124 == 0xffffffff) {
                if (uVar2 < 2) {
LAB_0016c453:
                  in_R8 = (live_range *)local_b4;
                  local_124 = get_stack_loc(gen_ctx,prVar30->start_mem_loc,MVar20,(bitmap_t)dst,
                                            (int *)in_R8);
                  goto LAB_0016c46f;
                }
                if (prVar30->used_locs == (VARR_bitmap_t *)0x0) goto LAB_0016ccaf;
                pMVar27 = (MIR_item_t_conflict)pcVar45;
                if (prVar30->busy_used_locs == (VARR_bitmap_t *)0x0) goto LAB_0016ccb4;
                ppVVar14 = prVar30->used_locs->varr;
                local_a0 = (ra_ctx *)prVar30->busy_used_locs->varr;
                pMVar49 = (MIR_item_t_conflict)0x0;
                local_124 = 0xffffffff;
                local_e0 = 0;
                local_dc = 0;
                local_b8 = 0;
                local_68 = (live_range_t)(ulong)(MVar20 << 0x10);
                local_70 = uVar48 << 0x20;
                do {
                  if (pMVar49 < (MIR_item_t_conflict)0x10 == bVar44 && MVar20 != MIR_T_LD) {
                    uVar39 = (uint)pMVar49;
                    if ((0x20 < (uVar39 & 0x3e)) || ((0x101000410U >> (uVar39 & 0x3e) & 1) == 0)) {
                      prVar30 = gen_ctx->ra_ctx;
                      pVVar13 = prVar30->curr_gaps;
                      if ((pVVar13 == (VARR_lr_gap_t *)0x0) || (pVVar13->varr == (lr_gap_t *)0x0))
                      goto LAB_0016cc73;
                      pVVar13->els_num = 0;
                      uVar38 = 0;
                      iVar4 = (int)prVar30->curr_reg_infos[uVar48].freq;
                      local_58 = (MIR_item_t_conflict)
                                 ((long)&pMVar49->data + local_70 + (long)&local_68->lr_bb);
                      lr_00 = local_90;
                      do {
                        pcVar45 = &DAT_00000001;
                        gen_ctx_00 = (gen_ctx_t)((ulong)pMVar49 & 0xffffffff);
                        iVar21 = available_hreg_p(uVar39,1,(int)ppVVar14,(bitmap_t *)lr_00,in_R8);
                        if (iVar21 == 0) {
                          pcVar45 = &DAT_00000001;
                          gen_ctx_00 = (gen_ctx_t)((ulong)pMVar49 & 0xffffffff);
                          iVar21 = available_hreg_p(uVar39,1,(int)local_a0,(bitmap_t *)lr_00,in_R8);
                          if (iVar21 == 0) {
                            if (lr_00->data == (void *)0x0) goto LAB_0016bf97;
                            pcVar45 = (char *)lr_00;
                            gen_ctx_00 = gen_ctx;
                            iVar21 = gap_lr_spill_cost(gen_ctx,(live_range_t_conflict)lr_00);
                            pVVar13 = gen_ctx->ra_ctx->curr_gaps;
                            pgVar25 = (gen_ctx_t)pVVar13->varr;
                            if (pgVar25 == (gen_ctx_t)0x0) goto LAB_0016cc27;
                            sVar33 = pVVar13->els_num;
                            uVar42 = sVar33 + 1;
                            if (pVVar13->size < uVar42) {
                              sVar33 = (uVar42 >> 1) + uVar42;
                              pcVar45 = (char *)(sVar33 * 0x10);
                              gen_ctx_00 = pgVar25;
                              pgVar25 = (gen_ctx_t)realloc(pgVar25,(size_t)pcVar45);
                              pVVar13->varr = (lr_gap_t *)pgVar25;
                              pVVar13->size = sVar33;
                              sVar33 = pVVar13->els_num;
                              uVar42 = sVar33 + 1;
                            }
                            pVVar13->els_num = uVar42;
                            pgVar25->call_used_hard_regs[sVar33 * 2 + -0xd] = (bitmap_t)local_58;
                            pgVar25->call_used_hard_regs[sVar33 * 2 + -0xc] = (bitmap_t)lr_00;
                          }
                          else {
                            pMVar27 = (MIR_item_t_conflict)gen_ctx->ra_ctx->curr_gaps;
                            if (pMVar27 == (MIR_item_t_conflict)0x0) goto LAB_0016cbfa;
                            if (pMVar27->data == (void *)0x0) {
                              pMVar37 = (MIR_item_t_conflict)0x0;
                            }
                            else {
                              pMVar29 = (pMVar27->item_link).prev;
                              if (pMVar29 == (MIR_item_t)0x0) goto LAB_0016cc22;
                              pMVar37 = *(MIR_item_t_conflict *)
                                         ((long)pMVar29 + (long)pMVar27->data * 0x10 + -8);
                            }
                            uVar42 = (ulong)*(int *)&lr_00->module;
                            if (-1 < (long)uVar42) {
                              do {
                                pVVar31 = gen_ctx->ra_ctx->lr_gap_bitmaps[(long)pMVar49];
                                if (((pVVar31 != (bitmap_t)0x0) && (uVar42 < pVVar31->els_num << 6))
                                   && ((pVVar31->varr[uVar42 >> 6] >> (uVar42 & 0x3f) & 1) != 0)) {
                                  local_50.start = (int)uVar42;
                                  in_R8 = (live_range *)local_80;
                                  gen_ctx_00 = (gen_ctx_t)gen_ctx->ra_ctx->lr_gap_tab;
                                  el.lr = &local_50;
                                  el._0_8_ = pMVar49;
                                  pcVar45 = (char *)pMVar49;
                                  iVar21 = HTAB_lr_gap_t_do((HTAB_lr_gap_t *)gen_ctx_00,el,HTAB_FIND
                                                            ,(lr_gap_t *)in_R8);
                                  lr_01 = (MIR_item_t_conflict)local_80._8_8_;
                                  uVar19 = local_80._0_8_;
                                  if (iVar21 != 0) {
                                    uVar23 = *(uint *)((long)(local_80._8_8_ + 8) + 4);
                                    uVar42 = (ulong)uVar23;
                                    if ((int)uVar23 < (int)*(uint *)&lr_00->module) {
                                      uVar42 = (ulong)*(uint *)&lr_00->module;
                                      goto LAB_0016c188;
                                    }
                                    pcVar45 = (char *)pMVar27;
                                    if (pMVar37 == (MIR_item_t_conflict)local_80._8_8_)
                                    goto LAB_0016c188;
                                    pMVar29 = (pMVar27->item_link).prev;
                                    if (pMVar29 == (MIR_item_t)0x0) goto LAB_0016ccb9;
                                    pvVar35 = pMVar27->data;
                                    pMVar34 = (MIR_module_t)((long)pvVar35 + 1);
                                    if (pMVar27->module < pMVar34) {
                                      pMVar34 = (MIR_module_t)
                                                ((long)&pMVar34->data + ((ulong)pMVar34 >> 1));
                                      pMVar29 = (MIR_item_t)realloc(pMVar29,(long)pMVar34 * 0x10);
                                      (pMVar27->item_link).prev = pMVar29;
                                      pMVar27->module = pMVar34;
                                      pvVar35 = pMVar27->data;
                                      pMVar34 = (MIR_module_t)((long)pvVar35 + 1);
                                    }
                                    pMVar27->data = pMVar34;
                                    (&pMVar29->data)[(long)pvVar35 * 2] = (void *)uVar19;
                                    (&pMVar29->module)[(long)pvVar35 * 2] = (MIR_module_t)lr_01;
                                    pcVar45 = (char *)lr_01;
                                    gen_ctx_00 = gen_ctx;
                                    iVar21 = gap_lr_spill_cost(gen_ctx,(live_range_t_conflict)lr_01)
                                    ;
                                    goto LAB_0016c327;
                                  }
                                }
                                bVar46 = 0 < (long)uVar42;
                                uVar42 = uVar42 - 1;
                              } while (bVar46);
                              uVar42 = (ulong)*(uint *)&lr_00->module;
                            }
LAB_0016c188:
                            iVar21 = 0;
                            lr_01 = pMVar37;
LAB_0016c327:
                            iVar22 = *(int *)((long)&lr_00->module + 4);
                            if ((int)uVar42 < iVar22) {
                              uVar23 = (int)uVar42 + 1;
                              uVar42 = (ulong)uVar23;
                              pVVar31 = gen_ctx->ra_ctx->lr_gap_bitmaps[(long)pMVar49];
                              if (pVVar31 != (bitmap_t)0x0) {
                                pMVar37 = (MIR_item_t_conflict)(long)(int)uVar23;
                                pcVar45 = (char *)(pVVar31->els_num << 6);
                                if ((pMVar37 < pcVar45) &&
                                   (pcVar45 = (char *)((ulong)pMVar37 >> 6),
                                   (pVVar31->varr[(long)pcVar45] >> ((ulong)pMVar37 & 0x3f) & 1) !=
                                   0)) {
                                  in_R8 = (live_range *)local_80;
                                  gen_ctx_00 = (gen_ctx_t)gen_ctx->ra_ctx->lr_gap_tab;
                                  el_00.lr = &local_50;
                                  el_00._0_8_ = pMVar49;
                                  pcVar45 = (char *)pMVar49;
                                  local_50.start = uVar23;
                                  iVar22 = HTAB_lr_gap_t_do((HTAB_lr_gap_t *)gen_ctx_00,el_00,
                                                            HTAB_FIND,(lr_gap_t *)in_R8);
                                  lr = local_80._8_8_;
                                  uVar19 = local_80._0_8_;
                                  if (iVar22 != 0) {
                                    pcVar45 = (char *)pMVar27;
                                    if (lr_01 != (MIR_item_t_conflict)local_80._8_8_) {
                                      pMVar29 = (pMVar27->item_link).prev;
                                      if (pMVar29 == (MIR_item_t)0x0) goto LAB_0016cbdc;
                                      pvVar35 = pMVar27->data;
                                      pMVar34 = (MIR_module_t)((long)pvVar35 + 1);
                                      if (pMVar27->module < pMVar34) {
                                        pMVar34 = (MIR_module_t)
                                                  ((long)&pMVar34->data + ((ulong)pMVar34 >> 1));
                                        pMVar29 = (MIR_item_t)realloc(pMVar29,(long)pMVar34 * 0x10);
                                        (pMVar27->item_link).prev = pMVar29;
                                        pMVar27->module = pMVar34;
                                        pvVar35 = pMVar27->data;
                                        pMVar34 = (MIR_module_t)((long)pvVar35 + 1);
                                      }
                                      pMVar27->data = pMVar34;
                                      (&pMVar29->data)[(long)pvVar35 * 2] = (void *)uVar19;
                                      (&pMVar29->module)[(long)pvVar35 * 2] = (MIR_module_t)lr;
                                      pcVar45 = (char *)lr;
                                      gen_ctx_00 = gen_ctx;
                                      iVar22 = gap_lr_spill_cost(gen_ctx,(live_range_t_conflict)lr);
                                      iVar21 = iVar21 + iVar22;
                                      lr_01 = (MIR_item_t_conflict)lr;
                                    }
                                    uVar42 = (ulong)*(uint *)((long)(lr + 8) + 4);
                                  }
                                }
                              }
                              goto LAB_0016c327;
                            }
                            uVar38 = ((uVar38 + iVar22) - *(int *)&lr_00->module) + 1;
                          }
                          iVar4 = iVar4 - iVar21;
                        }
                        lr_00 = (lr_00->item_link).next;
                      } while (lr_00 != (MIR_item_t)0x0);
                      if (-1 < iVar4) {
                        pVVar31 = gen_ctx->call_used_hard_regs[0x12];
                        if (pVVar31 == (bitmap_t)0x0) goto LAB_0016ccaa;
                        uVar23 = 0;
                        if (pMVar49 < (MIR_item_t_conflict)(pVVar31->els_num << 6)) {
                          uVar23 = (uint)(*pVVar31->varr >> ((ulong)pMVar49 & 0x3f)) & 1;
                        }
                        if ((((local_124 == 0xffffffff) || (local_dc < iVar4)) ||
                            ((iVar4 == local_dc && ((local_e0 != 0 && (uVar23 != 0)))))) ||
                           ((iVar4 == local_dc &&
                            ((local_e0 == (uVar23 == 0) && ((int)local_b8 < (int)uVar38)))))) {
                          prVar30 = gen_ctx->ra_ctx;
                          pcVar45 = (char *)(ulong)uVar38;
                          local_e0 = uVar23 ^ 1;
                          auVar18._0_8_ = prVar30->spill_gaps;
                          auVar18._8_8_ = prVar30->curr_gaps;
                          auVar18 = vpermilps_avx(auVar18,0x4e);
                          prVar30->spill_gaps = (VARR_lr_gap_t *)auVar18._0_8_;
                          prVar30->curr_gaps = (VARR_lr_gap_t *)auVar18._8_8_;
                          local_124 = uVar39;
                          local_dc = iVar4;
                          local_b8 = uVar38;
                        }
                      }
                    }
                  }
LAB_0016bf97:
                  pMVar49 = (MIR_item_t_conflict)((long)&pMVar49->data + 1);
                } while (pMVar49 != (MIR_item_t_conflict)0x22);
                if (local_124 == 0xffffffff) {
                  prVar30 = gen_ctx->ra_ctx;
                  goto LAB_0016c453;
                }
                setup_used_hard_regs(gen_ctx,MVar20,local_124);
                pcVar45 = "(with splitting live ranges)";
              }
              else {
                setup_used_hard_regs(gen_ctx,MVar20,local_124);
LAB_0016c46f:
                pcVar45 = "";
              }
              pFVar15 = (FILE *)gen_ctx->debug_file;
              if ((pFVar15 != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
                pcVar26 = MIR_reg_name(gen_ctx->ctx,local_94,func);
                in_stack_fffffffffffffec8 = (ulong)local_124;
                in_R8 = plVar12;
                fprintf(pFVar15," Assigning %s to %s:reg=%3u (freq %-3ld) -- %lu\n",pcVar45,pcVar26,
                        plVar12,gen_ctx->ra_ctx->curr_reg_infos[uVar48].freq,
                        in_stack_fffffffffffffec8);
                fwrite("  live range: ",0xe,1,(FILE *)gen_ctx->debug_file);
                print_live_ranges(gen_ctx,(live_range_t_conflict)local_90);
              }
              if ((bm == (bitmap_t)0x0) || (bm->varr == (bitmap_el_t *)0x0)) goto LAB_0016cc2c;
              bm->els_num = 0;
              prVar30 = gen_ctx->ra_ctx;
              pVVar13 = prVar30->spill_gaps;
              while( true ) {
                if (pVVar13 == (VARR_lr_gap_t *)0x0) goto LAB_0016cb9b;
                if (pVVar13->els_num == 0) break;
                plVar16 = pVVar13->varr;
                if (plVar16 == (lr_gap_t *)0x0) goto LAB_0016cba0;
                sVar33 = pVVar13->els_num - 1;
                pVVar13->els_num = sVar33;
                plVar1 = plVar16 + sVar33;
                uVar42._0_2_ = plVar1->hreg;
                uVar42._2_2_ = plVar1->type;
                uVar42._4_4_ = plVar1->reg;
                plVar28 = plVar16[sVar33].lr;
                if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (3 < gen_ctx->debug_level)) {
                  pcVar45 = "";
                  in_R8 = (live_range *)(ulong)(uint)(int)(short)(undefined2)uVar42;
                  if (uVar42._4_4_ == iVar3) {
                    pcVar45 = "*";
                  }
                  in_stack_fffffffffffffec8 =
                       CONCAT44((int)(in_stack_fffffffffffffec8 >> 0x20),plVar28->finish);
                  fprintf((FILE *)gen_ctx->debug_file,"   Splitting lr gap: r%d%s, h%d [%d..%d]\n",
                          uVar42 >> 0x20,pcVar45,in_R8,(ulong)(uint)plVar28->start,
                          in_stack_fffffffffffffec8);
                }
                plVar47 = plVar28->lr_bb;
                if (plVar47 != (lr_bb_t_conflict)0x0) {
                  do {
                    pVVar31 = plVar47->bb->gen;
                    bitmap_expand(pVVar31,(uVar42 >> 0x20) + 1);
                    if (pVVar31 == (bitmap_t)0x0) goto LAB_0016cb54;
                    pVVar31->varr[uVar42 >> 0x26] =
                         pVVar31->varr[uVar42 >> 0x26] | 1L << (uVar42 >> 0x20 & 0x3f);
                    plVar47 = plVar47->next;
                  } while (plVar47 != (lr_bb_t)0x0);
                }
                if (uVar42._4_4_ == iVar3) {
                  uVar42 = (ulong)plVar28->start;
                  bitmap_expand(bm,uVar42 + 1);
                  bm->varr[uVar42 >> 6] = bm->varr[uVar42 >> 6] | 1L << (uVar42 & 0x3f);
                }
                else {
                  lVar41 = 0;
                  do {
                    if (plVar28->lr_bb == (lr_bb_t_conflict)0x0) {
LAB_0016cb30:
                      __assert_fail("lr->lr_bb != ((void*)0) && gen_ctx->ra_ctx->lr_gap_bitmaps[hreg] != ((void*)0)"
                                    ,
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                    ,0x1c51,"void delete_lr_gap(gen_ctx_t, int, live_range_t)");
                    }
                    prVar30 = gen_ctx->ra_ctx;
                    uVar39 = (int)(short)(undefined2)uVar42 + (int)lVar41;
                    pVVar31 = prVar30->lr_gap_bitmaps[(int)uVar39];
                    if (pVVar31 == (bitmap_t)0x0) goto LAB_0016cb30;
                    iVar4 = plVar28->start;
                    if ((ulong)(long)iVar4 < pVVar31->els_num << 6) {
                      bVar17 = (byte)iVar4 & 0x3f;
                      pVVar31->varr[(ulong)(long)iVar4 >> 6] =
                           pVVar31->varr[(ulong)(long)iVar4 >> 6] &
                           (-2L << bVar17 | 0xfffffffffffffffeU >> 0x40 - bVar17);
                    }
                    el_01._0_4_ = uVar39 & 0xffff;
                    el_01.reg = 0;
                    el_01.lr = plVar28;
                    HTAB_lr_gap_t_do(prVar30->lr_gap_tab,el_01,HTAB_DELETE,(lr_gap_t *)&local_50);
                    iVar4 = plVar28->start;
                    iVar21 = plVar28->finish;
                    in_R8 = (live_range *)(long)iVar4;
                    if (iVar4 <= iVar21) {
                      bVar17 = (byte)uVar39 & 0x3f;
                      in_R8 = (live_range *)0x0;
                      do {
                        pVVar31 = ppVVar9[(long)((long)&in_R8->lr_bb +
                                                (long)&((live_range *)(long)iVar4)->lr_bb)];
                        if (pVVar31 == (bitmap_t)0x0) goto LAB_0016cafd;
                        if ((ulong)uVar39 < pVVar31->els_num << 6) {
                          pVVar31->varr[uVar39 >> 6] =
                               pVVar31->varr[uVar39 >> 6] &
                               (-2L << bVar17 | 0xfffffffffffffffeU >> 0x40 - bVar17);
                        }
                        in_R8 = (live_range *)((long)&in_R8->lr_bb + 1);
                      } while ((iVar21 - iVar4) + 1 != (int)in_R8);
                    }
                    lVar41 = lVar41 + 1;
                  } while (lVar41 != (ulong)(((uint)uVar42 & 0xffff0000) == 0xa0000 &&
                                            0x21 < (uint)(int)(short)(undefined2)uVar42) + 1);
                }
                prVar30 = gen_ctx->ra_ctx;
                pVVar13 = prVar30->spill_gaps;
              }
              pVVar6 = prVar30->reg_renumber;
              if (((pVVar6 == (VARR_MIR_reg_t *)0x0) || (pVVar6->varr == (MIR_reg_t *)0x0)) ||
                 (pVVar6->els_num <= uVar48)) goto LAB_0016cc0e;
              pVVar6->varr[uVar48] = local_124;
              bVar44 = 0x21 < local_124;
              local_b4._0_4_ = (MVar20 == MIR_T_LD && bVar44) + 1;
              pVVar11 = gen_ctx->lr_ctx->var_live_ranges;
              if (((pVVar11 == (VARR_live_range_t *)0x0) ||
                  (pVVar11->varr == (live_range_t_conflict *)0x0)) || (pVVar11->els_num <= uVar48))
              goto LAB_0016cc09;
              plVar28 = pVVar11->varr[uVar48];
              if (plVar28 != (live_range_t_conflict)0x0) {
                uVar42 = (ulong)(uint)local_b4._0_4_;
                do {
                  uVar50 = (ulong)plVar28->start;
                  if (((uVar2 < 2 || bVar44) || (bm->els_num << 6 <= uVar50)) ||
                     ((bm->varr[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0)) {
                    uVar51 = uVar42;
                    uVar39 = local_124;
                    if (plVar28->start <= plVar28->finish) {
                      do {
                        pVVar31 = ppVVar9[uVar50];
                        bitmap_expand(pVVar31,(ulong)uVar39 + 1);
                        if (pVVar31 == (bitmap_t)0x0) {
                          assign_cold_44();
LAB_0016cafd:
                          assign_cold_42();
LAB_0016cb02:
                          assign_cold_26();
LAB_0016cb07:
                          assign_cold_25();
                          goto LAB_0016cb0c;
                        }
                        pVVar31->varr[uVar39 >> 6] =
                             pVVar31->varr[uVar39 >> 6] | 1L << ((ulong)uVar39 & 0x3f);
                        uVar51 = uVar51 - 1;
                        uVar39 = uVar39 + 1;
                      } while ((uVar51 != 0) ||
                              (bVar46 = (long)uVar50 < (long)plVar28->finish, uVar51 = uVar42,
                              uVar39 = local_124, uVar50 = uVar50 + 1, bVar46));
                    }
                    if (uVar2 >= 2 && !bVar44) {
                      uVar50 = uVar42;
                      uVar39 = local_124;
                      if (plVar28->lr_bb == (lr_bb_t_conflict)0x0) goto LAB_0016ca69;
                      do {
                        if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) &&
                           (3 < gen_ctx->debug_level)) {
                          fprintf((FILE *)gen_ctx->debug_file,
                                  "    Adding lr gap: r%d, h%d [%d..%d]\n",plVar12,(ulong)uVar39,
                                  (ulong)(uint)plVar28->start,(ulong)(uint)plVar28->finish);
                        }
                        if (plVar28->lr_bb == (lr_bb_t_conflict)0x0) goto LAB_0016cb59;
                        uVar51 = (ulong)plVar28->start;
                        pVVar31 = gen_ctx->ra_ctx->lr_gap_bitmaps[(int)uVar39];
                        if (pVVar31 == (bitmap_t)0x0) {
                          uVar38 = (plVar28->start * 3) / 2 + 0x3f;
                          uVar43 = (ulong)(long)(int)uVar38 >> 6;
                          local_a0 = gen_ctx->ra_ctx;
                          pVVar31 = (bitmap_t)malloc(0x18);
                          pVVar31->els_num = 0;
                          if (uVar38 < 0x40) {
                            uVar43 = 0x40;
                          }
                          pVVar31->size = uVar43;
                          pbVar32 = (bitmap_el_t *)malloc(uVar43 << 3);
                          pVVar31->varr = pbVar32;
                          local_a0->lr_gap_bitmaps[(int)uVar39] = pVVar31;
                          pVVar31 = gen_ctx->ra_ctx->lr_gap_bitmaps[(int)uVar39];
                          bitmap_expand(pVVar31,uVar51 + 1);
                          if (pVVar31 == (bitmap_t)0x0) goto LAB_0016cb7d;
                        }
                        else {
                          bitmap_expand(pVVar31,uVar51 + 1);
                        }
                        in_R8 = &local_50;
                        el_02._0_8_ = (ulong)(uVar39 & 0xffff | MVar20 << 0x10) | uVar48 << 0x20;
                        pVVar31->varr[uVar51 >> 6] =
                             pVVar31->varr[uVar51 >> 6] | 1L << (uVar51 & 0x3f);
                        el_02.lr = plVar28;
                        HTAB_lr_gap_t_do(gen_ctx->ra_ctx->lr_gap_tab,el_02,HTAB_INSERT,
                                         (lr_gap_t *)in_R8);
                        uVar50 = uVar50 - 1;
                        uVar39 = uVar39 + 1;
                      } while (uVar50 != 0);
                    }
                  }
                  else if (plVar28->lr_bb == (lr_bb_t_conflict)0x0) {
LAB_0016ca69:
                    uVar50 = uVar42;
                    uVar39 = local_124;
                    lVar41 = (long)plVar28->start;
                    if (plVar28->start <= plVar28->finish) {
                      do {
                        pVVar31 = (bitmap_t)((void **)local_b4._12_8_)[lVar41];
                        bitmap_expand(pVVar31,(ulong)uVar39 + 1);
                        if (pVVar31 == (bitmap_t)0x0) {
LAB_0016cb0c:
                          assign_cold_46();
LAB_0016cb11:
                          __assert_fail("bitmap_bit_p (used_locs_addr[j], hard_reg)",
                                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                        ,0x1db1,"void assign(gen_ctx_t)");
                        }
                        pVVar31->varr[uVar39 >> 6] =
                             pVVar31->varr[uVar39 >> 6] | 1L << ((ulong)uVar39 & 0x3f);
                        uVar50 = uVar50 - 1;
                        uVar39 = uVar39 + 1;
                      } while ((uVar50 != 0) ||
                              (bVar46 = lVar41 < plVar28->finish, uVar50 = uVar42,
                              uVar39 = local_124, lVar41 = lVar41 + 1, bVar46));
                    }
                  }
                  plVar28 = plVar28->next;
                } while (plVar28 != (live_range_t)0x0);
              }
            }
          }
          else {
            pcVar45 = MIR_reg_hard_reg_name((MIR_context_t)local_60,reg,func);
            uVar39 = _MIR_get_hard_reg((MIR_context_t)pgVar25,pcVar45);
            if (0x21 < uVar39) goto LAB_0016cc4a;
            pVVar6 = gen_ctx->ra_ctx->reg_renumber;
            if (((pVVar6 == (VARR_MIR_reg_t *)0x0) || (pVVar6->varr == (MIR_reg_t *)0x0)) ||
               (pVVar6->els_num <= uVar48)) goto LAB_0016cbeb;
            pVVar6->varr[uVar48] = uVar39;
            pVVar11 = gen_ctx->lr_ctx->var_live_ranges;
            if (((pVVar11 == (VARR_live_range_t *)0x0) ||
                (pVVar11->varr == (live_range_t_conflict *)0x0)) || (pVVar11->els_num <= uVar48))
            goto LAB_0016cbe1;
            plVar28 = pVVar11->varr[uVar48];
            if (plVar28 != (live_range_t_conflict)0x0) {
              do {
                iVar3 = plVar28->start;
                in_R8 = (live_range *)(long)iVar3;
                if (iVar3 <= plVar28->finish) {
                  in_R8 = (live_range *)0x0;
                  do {
                    pVVar31 = ppVVar9[(long)((long)&in_R8->lr_bb +
                                            (long)&((live_range *)(long)iVar3)->lr_bb)];
                    if (pVVar31 == (bitmap_t)0x0) {
                      assign_cold_27();
                      goto LAB_0016cb54;
                    }
                    if ((pVVar31->els_num << 6 <= (ulong)uVar39) ||
                       ((*pVVar31->varr & 1L << ((ulong)uVar39 & 0x3f)) == 0)) goto LAB_0016cb11;
                    in_R8 = (live_range *)((long)&in_R8->lr_bb + 1);
                  } while ((plVar28->finish - iVar3) + 1 != (int)in_R8);
                }
                plVar28 = plVar28->next;
              } while (plVar28 != (live_range_t)0x0);
            }
            if (pcVar45 == (char *)0x0) {
              setup_used_hard_regs(gen_ctx,MVar20,uVar39);
            }
            pFVar15 = (FILE *)gen_ctx->debug_file;
            if ((pFVar15 != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
              pcVar45 = MIR_reg_name(gen_ctx->ctx,reg,func);
              in_R8 = (live_range *)gen_ctx->ra_ctx->curr_reg_infos[uVar48].freq;
              fprintf(pFVar15," Assigning to global %s:reg=%3u (freq %-3ld) -- %lu\n",pcVar45,
                      plVar12,in_R8,(ulong)uVar39);
            }
          }
        }
        uVar42 = local_88 + 1;
      } while (uVar42 != local_b4._4_8_);
    }
    return;
  }
LAB_0016cc82:
  assign_cold_57();
LAB_0016cc87:
  assign_cold_8();
LAB_0016cc8c:
  assign_cold_30();
LAB_0016cc91:
  assign_cold_31();
LAB_0016cc96:
  assign_cold_66();
LAB_0016cc9b:
  assign_cold_61();
LAB_0016cca0:
  assign_cold_60();
LAB_0016cca5:
  assign_cold_59();
LAB_0016ccaa:
  assign_cold_36();
LAB_0016ccaf:
  assign_cold_40();
  pMVar27 = (MIR_item_t_conflict)pcVar45;
LAB_0016ccb4:
  assign_cold_39();
LAB_0016ccb9:
  assign_cold_33();
  output_bitmap(gen_ctx_00,"  live_in:",*(bitmap_t *)&pMVar27[1].item_type,1,(MIR_reg_t *)0x0);
  output_bitmap(gen_ctx_00,"  live_out:",(bitmap_t)pMVar27[1].ref_def,1,(MIR_reg_t *)0x0);
  output_bitmap(gen_ctx_00,"  spill_gen:",(bitmap_t)pMVar27[1].addr,1,(MIR_reg_t *)0x0);
  output_bitmap(gen_ctx_00,"  spill_kill:",*(bitmap_t *)&pMVar27[1].export_p,1,(MIR_reg_t *)0x0);
  return;
}

Assistant:

static void assign (gen_ctx_t gen_ctx) {
  MIR_context_t ctx = gen_ctx->ctx;
  MIR_reg_t best_loc, i, reg, var, max_var = get_max_var (gen_ctx);
  MIR_type_t type;
  int slots_num;
  int j, k, simple_loc_update_p, reserve_p, nregs;
  live_range_t start_lr, lr;
  bitmap_t bm;
  size_t length;
  bitmap_t *used_locs_addr, *busy_used_locs_addr;
  allocno_info_t allocno_info;
  MIR_func_t func = curr_func_item->u.func;
  bitmap_t global_hard_regs = _MIR_get_module_global_var_hard_regs (ctx, curr_func_item->module);
  const char *msg;
  const int simplified_p = ONLY_SIMPLIFIED_RA || optimize_level < 2;
  bitmap_t conflict_locs = conflict_locs1, spill_lr_starts = temp_bitmap2;

  func_stack_slots_num = 0;
  curr_reg_infos = VARR_ADDR (reg_info_t, curr_cfg->reg_info);
  VARR_TRUNC (MIR_reg_t, reg_renumber, 0);
  for (i = 0; i <= max_var; i++) {
    VARR_PUSH (MIR_reg_t, reg_renumber, MIR_NON_VAR);
  }
  /* max_var for func */
  VARR_TRUNC (allocno_info_t, sorted_regs, 0);
  allocno_info.reg_infos = curr_reg_infos;
  start_mem_loc = MAX_HARD_REG + 1;
  for (reg = MAX_HARD_REG + 1; reg <= max_var; reg++) {
    allocno_info.reg = reg;
    allocno_info.tied_reg_p = bitmap_bit_p (tied_regs, reg);
    if (bitmap_bit_p (addr_regs, reg)) {
      type = MIR_reg_type (gen_ctx->ctx, reg - MAX_HARD_REG, func);
      best_loc = get_new_stack_slot (gen_ctx, type, &slots_num);
      VARR_SET (MIR_reg_t, reg_renumber, reg, best_loc);
      start_mem_loc = best_loc + slots_num;
      DEBUG (2, {
        fprintf (debug_file, " Assigning to addressable %s:reg=%3u (freq %-3ld) -- %lu\n",
                 MIR_reg_name (gen_ctx->ctx, reg - MAX_HARD_REG, func), reg,
                 curr_reg_infos[reg].freq, (unsigned long) best_loc);
      });
      continue;
    }
    VARR_PUSH (allocno_info_t, sorted_regs, allocno_info);
    for (length = 0, lr = VARR_GET (live_range_t, var_live_ranges, reg); lr != NULL; lr = lr->next)
      length += lr->finish - lr->start + 1;
    curr_reg_infos[reg].live_length = length;
  }
  for (int n = 0; n <= curr_point && n < (int) VARR_LENGTH (bitmap_t, used_locs); n++)
    if (global_hard_regs == NULL) {
      bitmap_clear (VARR_GET (bitmap_t, used_locs, n));
      if (!simplified_p) bitmap_clear (VARR_GET (bitmap_t, busy_used_locs, n));
    } else {
      bitmap_copy (VARR_GET (bitmap_t, used_locs, n), global_hard_regs);
      if (!simplified_p) bitmap_copy (VARR_GET (bitmap_t, busy_used_locs, n), global_hard_regs);
    }
  while ((int) VARR_LENGTH (bitmap_t, used_locs) <= curr_point) {
    bm = bitmap_create2 (MAX_HARD_REG + 1);
    if (global_hard_regs != NULL) bitmap_copy (bm, global_hard_regs);
    VARR_PUSH (bitmap_t, used_locs, bm);
    if (!simplified_p) {
      bm = bitmap_create2 (MAX_HARD_REG + 1);
      if (global_hard_regs != NULL) bitmap_copy (bm, global_hard_regs);
      VARR_PUSH (bitmap_t, busy_used_locs, bm);
    }
  }
  nregs = (int) VARR_LENGTH (allocno_info_t, sorted_regs);
  qsort (VARR_ADDR (allocno_info_t, sorted_regs), nregs, sizeof (allocno_info_t),
         allocno_info_compare_func);
  used_locs_addr = VARR_ADDR (bitmap_t, used_locs);
  busy_used_locs_addr = VARR_ADDR (bitmap_t, busy_used_locs);
  /* Mark ranges used by hard regs for pseudo reg splitting: */
  for (i = 0; i <= MAX_HARD_REG; i++) {
    for (lr = VARR_GET (live_range_t, var_live_ranges, i); lr != NULL; lr = lr->next)
      for (j = lr->start; j <= lr->finish; j++) {
        bitmap_set_bit_p (used_locs_addr[j], i);
        if (!simplified_p) bitmap_set_bit_p (busy_used_locs_addr[j], i);
      }
  }
  bitmap_clear (func_used_hard_regs);
  if (!simplified_p) HTAB_CLEAR (lr_gap_t, lr_gap_tab);
  for (int n = 0; n < nregs; n++) { /* hard reg and stack slot assignment */
    reg = VARR_GET (allocno_info_t, sorted_regs, n).reg;
    if (VARR_GET (MIR_reg_t, reg_renumber, reg) != MIR_NON_VAR) continue;
    type = MIR_reg_type (gen_ctx->ctx, reg - MAX_HARD_REG, func);
    if (VARR_GET (allocno_info_t, sorted_regs, n).tied_reg_p) {
      const char *hard_reg_name = MIR_reg_hard_reg_name (ctx, reg - MAX_HARD_REG, func);
      int hard_reg = _MIR_get_hard_reg (ctx, hard_reg_name);
      gen_assert (hard_reg >= 0 && hard_reg <= MAX_HARD_REG
                  && target_locs_num (hard_reg, type) == 1);
      VARR_SET (MIR_reg_t, reg_renumber, reg, hard_reg);
#ifndef NDEBUG
      for (lr = VARR_GET (live_range_t, var_live_ranges, reg); lr != NULL; lr = lr->next)
        for (j = lr->start; j <= lr->finish; j++)
          gen_assert (bitmap_bit_p (used_locs_addr[j], hard_reg));
#endif
      if (hard_reg_name == NULL) setup_used_hard_regs (gen_ctx, type, hard_reg);
      DEBUG (2, {
        fprintf (debug_file, " Assigning to global %s:reg=%3u (freq %-3ld) -- %lu\n",
                 MIR_reg_name (gen_ctx->ctx, reg - MAX_HARD_REG, func), reg,
                 curr_reg_infos[reg].freq, (unsigned long) hard_reg);
      });
      continue;
    }
    var = reg;
    if ((start_lr = VARR_GET (live_range_t, var_live_ranges, var)) == NULL) continue;
    bitmap_clear (conflict_locs);
    for (lr = start_lr; lr != NULL; lr = lr->next) {
      for (j = lr->start; j <= lr->finish; j++)
        bitmap_ior (conflict_locs, conflict_locs, used_locs_addr[j]);
    }
    msg = "";
    VARR_TRUNC (lr_gap_t, spill_gaps, 0);
    if ((best_loc = get_hard_reg (gen_ctx, type, conflict_locs)) != MIR_NON_VAR) {
      setup_used_hard_regs (gen_ctx, type, best_loc);
    } else if (!simplified_p
               && ((best_loc = get_hard_reg_with_split (gen_ctx, reg, type, start_lr))
                   != MIR_NON_VAR)) {
      /* try to use gaps in already allocated pseudos or given pseudo: */
      setup_used_hard_regs (gen_ctx, type, best_loc);
      msg = "(with splitting live ranges)";
    } else {
      best_loc = get_stack_loc (gen_ctx, start_mem_loc, type, conflict_locs, &slots_num);
    }
    DEBUG (2, {
      fprintf (debug_file, " Assigning %s to %s:reg=%3u (freq %-3ld) -- %lu\n", msg,
               MIR_reg_name (gen_ctx->ctx, reg - MAX_HARD_REG, func), reg, curr_reg_infos[reg].freq,
               (unsigned long) best_loc);
      fprintf (debug_file, "  live range: ");
      print_live_ranges (gen_ctx, start_lr);
    });
    bitmap_clear (spill_lr_starts);
    while (VARR_LENGTH (lr_gap_t, spill_gaps) != 0) {
      lr_gap_t lr_gap = VARR_POP (lr_gap_t, spill_gaps);
      DEBUG (4, {
        fprintf (debug_file, "   Splitting lr gap: r%d%s, h%d [%d..%d]\n", lr_gap.reg,
                 lr_gap.reg == reg ? "*" : "", lr_gap.hreg, lr_gap.lr->start, lr_gap.lr->finish);
      });
      for (lr_bb_t lr_bb = lr_gap.lr->lr_bb; lr_bb != NULL; lr_bb = lr_bb->next)
        bitmap_set_bit_p (lr_bb->bb->spill_gen, lr_gap.reg);
      if (lr_gap.reg == reg) {
        bitmap_set_bit_p (spill_lr_starts, lr_gap.lr->start);
        continue; /* spilled gap of the current reg */
      }
      slots_num = target_locs_num (lr_gap.hreg, lr_gap.type);
      for (k = 0; k < slots_num; k++) {
        MIR_reg_t curr_hr = target_nth_loc (lr_gap.hreg, lr_gap.type, k);
        delete_lr_gap (gen_ctx, curr_hr, lr_gap.lr);
        for (j = lr_gap.lr->start; j <= lr_gap.lr->finish; j++)
          bitmap_clear_bit_p (used_locs_addr[j], curr_hr);
      }
    }
    VARR_SET (MIR_reg_t, reg_renumber, reg, best_loc);
    slots_num = target_locs_num (best_loc, type);
    simple_loc_update_p = simplified_p || best_loc > MAX_HARD_REG;
    for (lr = VARR_GET (live_range_t, var_live_ranges, var); lr != NULL; lr = lr->next) {
      if ((reserve_p = simple_loc_update_p || !bitmap_bit_p (spill_lr_starts, lr->start))) {
        for (j = lr->start; j <= lr->finish; j++)
          for (k = 0; k < slots_num; k++)
            bitmap_set_bit_p (used_locs_addr[j], target_nth_loc (best_loc, type, k));
      }
      if (simple_loc_update_p) continue;
      if (lr->lr_bb == NULL) {
        for (j = lr->start; j <= lr->finish; j++)
          for (k = 0; k < slots_num; k++)
            bitmap_set_bit_p (busy_used_locs_addr[j], target_nth_loc (best_loc, type, k));
      } else if (reserve_p) {
        for (k = 0; k < slots_num; k++) {
          MIR_reg_t hr = target_nth_loc (best_loc, type, k);
          DEBUG (4, {
            fprintf (debug_file, "    Adding lr gap: r%d, h%d [%d..%d]\n", reg, hr, lr->start,
                     lr->finish);
          });
          insert_lr_gap (gen_ctx, hr, type, reg, lr);
        }
      }
    }
  }
}